

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void cmCacheManager::OutputNewlineTruncationWarning
               (ostream *fout,string *key,string *value,cmMessenger *messenger)

{
  long lVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string comment;
  string local_78;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  char *local_30;
  
  lVar1 = std::__cxx11::string::find((char)value,10);
  if (lVar1 != -1) {
    if (messenger != (cmMessenger *)0x0) {
      local_40 = (key->_M_dataplus)._M_p;
      local_48 = key->_M_string_length;
      local_58._M_len = 9;
      local_58._M_str = "Value of ";
      local_38 = 0x20;
      local_30 = " contained a newline; truncating";
      views._M_len = 3;
      views._M_array = &local_58;
      cmCatViews_abi_cxx11_(&local_78,views);
      local_58._M_len = 0;
      local_58._M_str = (char *)0x0;
      cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_58);
      cmMessenger::IssueMessage(messenger,WARNING,&local_78,(cmListFileBacktrace *)&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_str !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_str);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    local_40 = (key->_M_dataplus)._M_p;
    local_48 = key->_M_string_length;
    local_58._M_len = 0x12;
    local_58._M_str = "WARNING: Value of ";
    local_38 = 0x37;
    local_30 = " contained a newline and was truncated. Original value:";
    views_00._M_len = 3;
    views_00._M_array = &local_58;
    cmCatViews_abi_cxx11_(&local_78,views_00);
    OutputWarningComment(fout,&local_78,true);
    OutputWarningComment(fout,value,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmCacheManager::OutputNewlineTruncationWarning(std::ostream& fout,
                                                    std::string const& key,
                                                    std::string const& value,
                                                    cmMessenger* messenger)
{
  if (value.find('\n') != std::string::npos) {
    if (messenger) {
      std::string message =
        cmStrCat("Value of ", key, " contained a newline; truncating");
      messenger->IssueMessage(MessageType::WARNING, message);
    }

    std::string comment =
      cmStrCat("WARNING: Value of ", key,
               " contained a newline and was truncated. Original value:");

    OutputWarningComment(fout, comment, true);
    OutputWarningComment(fout, value, false);
  }
}